

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfloat16.cpp
# Opt level: O1

QTextStream * operator>>(QTextStream *ts,qfloat16 *f16)

{
  ushort uVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  float f;
  float local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = -NAN;
  QTextStream::operator>>(ts,&local_24);
  uVar3 = (ulong)(((uint)local_24 >> 0x17) * 2);
  uVar1 = *(ushort *)((long)qfloat16::shifttable + uVar3);
  uVar4 = (uint)local_24 & 0x7fffff;
  bVar2 = (byte)uVar1;
  if ((~(uint)local_24 & 0x7f800000) == 0) {
    if ((uVar4 != 0) && (uVar5 = 1 << (bVar2 & 0x1f), uVar4 < uVar5)) {
      uVar4 = uVar5;
    }
  }
  else {
    uVar4 = (uVar4 + qfloat16::roundtable[(uint)local_24 >> 0x17]) -
            (uint)((uVar4 + qfloat16::roundtable[(uint)local_24 >> 0x17] >> (uVar1 & 0x1f) & 1) != 0
                  );
  }
  (f16->field_0).b16 =
       *(short *)((long)qfloat16::basetable + uVar3) + (short)(uVar4 >> (bVar2 & 0x1f));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return ts;
}

Assistant:

QTextStream &operator>>(QTextStream &ts, qfloat16 &f16)
{
    float f;
    ts >> f;
    f16 = qfloat16(f);
    return ts;
}